

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

bool __thiscall
PDA::inCombinations(PDA *this,vector<State_*,_std::allocator<State_*>_> *combination,
                   vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                   *combinations)

{
  bool bVar1;
  reference __x;
  size_type sVar2;
  reference ppSVar3;
  string *__lhs;
  string *__rhs;
  undefined1 local_58 [4];
  int i;
  vector<State_*,_std::allocator<State_*>_> possibleCombination;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  *__range1;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  *combinations_local;
  vector<State_*,_std::allocator<State_*>_> *combination_local;
  PDA *this_local;
  
  __end1 = std::
           vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
           ::begin(combinations);
  possibleCombination.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                ::end(combinations);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<State_*,_std::allocator<State_*>_>_*,_std::vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>_>
                                     *)&possibleCombination.
                                        super__Vector_base<State_*,_std::allocator<State_*>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<std::vector<State_*,_std::allocator<State_*>_>_*,_std::vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>_>
          ::operator*(&__end1);
    std::vector<State_*,_std::allocator<State_*>_>::vector
              ((vector<State_*,_std::allocator<State_*>_> *)local_58,__x);
    sVar2 = std::vector<State_*,_std::allocator<State_*>_>::size
                      ((vector<State_*,_std::allocator<State_*>_> *)local_58);
    if (sVar2 == 0) {
LAB_0013f134:
      bVar1 = false;
    }
    else {
      ppSVar3 = std::vector<State_*,_std::allocator<State_*>_>::operator[]
                          ((vector<State_*,_std::allocator<State_*>_> *)local_58,0);
      __lhs = State::getName_abi_cxx11_(*ppSVar3);
      ppSVar3 = std::vector<State_*,_std::allocator<State_*>_>::operator[](combination,0);
      __rhs = State::getName_abi_cxx11_(*ppSVar3);
      bVar1 = std::operator!=(__lhs,__rhs);
      if (bVar1) goto LAB_0013f134;
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    std::vector<State_*,_std::allocator<State_*>_>::~vector
              ((vector<State_*,_std::allocator<State_*>_> *)local_58);
    if (bVar1) goto LAB_0013f163;
    __gnu_cxx::
    __normal_iterator<std::vector<State_*,_std::allocator<State_*>_>_*,_std::vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 0;
LAB_0013f163:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PDA::inCombinations(std::vector<State *> combination, std::vector<std::vector<State *>> combinations) {
    for(auto possibleCombination: combinations){
        for (int i = 0; i < possibleCombination.size(); ++i) {
            if(possibleCombination[i]->getName() != combination[i]->getName()) {
                break;
            }
            return true;
        }
    }
    return false;
}